

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O0

void __thiscall pg::PPSolver::PPSolver(PPSolver *this,Oink *oink,Game *game)

{
  size_t newsize;
  long lVar1;
  Game *game_local;
  Oink *oink_local;
  PPSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__PPSolver_002c7630;
  newsize = Game::nodecount(game);
  bitset::bitset(&this->Z,newsize);
  lVar1 = Game::nodecount(game);
  uintqueue::uintqueue(&this->Q,(uint)lVar1);
  return;
}

Assistant:

PPSolver::PPSolver(Oink& oink, Game& game) : Solver(oink, game), Z(game.nodecount()), Q(game.nodecount())
{
}